

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void * TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::ThreadWork
                 (void *voidptr)

{
  TPZDohrAssembleList<double> *this;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> data;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> local_68;
  TPZAutoPointer<TPZDohrAssembleItem<double>_> local_50;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> local_48;
  
  PopItem(&local_68,
          (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *)voidptr);
  if (local_68.fSubStructure.fRef != (TPZReference *)0x0) {
    do {
      if ((local_68.fSubStructure.fRef)->fPointer == (TPZDohrSubstructCondense<double> *)0x0) break;
      TPZDohrSubstructCondense<double>::Contribute_v2_local
                ((local_68.fSubStructure.fRef)->fPointer,(local_68.fInput_local.fRef)->fPointer,
                 &(local_68.fv2_local.fRef)->fPointer->fAssembleData);
      this = (TPZDohrAssembleList<double> *)**(undefined8 **)((long)voidptr + 0x40);
      local_50.fRef = local_68.fv2_local.fRef;
      LOCK();
      ((local_68.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_68.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      TPZDohrAssembleList<double>::AddItem(this,&local_50);
      TPZAutoPointer<TPZDohrAssembleItem<double>_>::~TPZAutoPointer(&local_50);
      PopItem(&local_48,
              (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *)voidptr);
      TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::operator=
                (&local_68,&local_48);
      TPZAutoPointer<TPZDohrAssembleItem<double>_>::~TPZAutoPointer(&local_48.fv2_local);
      TPZAutoPointer<TPZFMatrix<double>_>::~TPZAutoPointer(&local_48.fInput_local);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&local_48.fSubStructure);
    } while (local_68.fSubStructure.fRef != (TPZReference *)0x0);
  }
  TPZAutoPointer<TPZDohrAssembleItem<double>_>::~TPZAutoPointer(&local_68.fv2_local);
  TPZAutoPointer<TPZFMatrix<double>_>::~TPZAutoPointer(&local_68.fInput_local);
  TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&local_68.fSubStructure);
  return voidptr;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}